

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcsample.c
# Opt level: O2

void h2v2_downsample(j_compress_ptr cinfo,jpeg_component_info *compptr,JSAMPARRAY input_data,
                    JSAMPARRAY output_data)

{
  JDIMENSION JVar1;
  JSAMPROW pJVar2;
  JSAMPROW pJVar3;
  JSAMPROW pJVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  
  JVar1 = compptr->width_in_blocks;
  expand_right_edge(input_data,cinfo->max_v_samp_factor,cinfo->image_width,JVar1 << 4);
  lVar5 = 0;
  for (lVar6 = 0; lVar6 < compptr->v_samp_factor; lVar6 = lVar6 + 1) {
    pJVar2 = output_data[lVar6];
    pJVar3 = input_data[lVar5];
    pJVar4 = input_data[lVar5 + 1];
    uVar8 = 1;
    for (lVar7 = 0; JVar1 * 8 != (int)lVar7; lVar7 = lVar7 + 1) {
      pJVar2[lVar7] =
           (JSAMPLE)(pJVar3[lVar7 * 2] + uVar8 +
                     (uint)pJVar4[lVar7 * 2] + (uint)pJVar3[lVar7 * 2 + 1] +
                     (uint)pJVar4[lVar7 * 2 + 1] >> 2);
      uVar8 = uVar8 ^ 3;
    }
    lVar5 = lVar5 + 2;
  }
  return;
}

Assistant:

METHODDEF(void)
h2v2_downsample(j_compress_ptr cinfo, jpeg_component_info *compptr,
                JSAMPARRAY input_data, JSAMPARRAY output_data)
{
  int inrow, outrow;
  JDIMENSION outcol;
  JDIMENSION output_cols = compptr->width_in_blocks * DCTSIZE;
  register JSAMPROW inptr0, inptr1, outptr;
  register int bias;

  /* Expand input data enough to let all the output samples be generated
   * by the standard loop.  Special-casing padded output would be more
   * efficient.
   */
  expand_right_edge(input_data, cinfo->max_v_samp_factor, cinfo->image_width,
                    output_cols * 2);

  inrow = 0;
  for (outrow = 0; outrow < compptr->v_samp_factor; outrow++) {
    outptr = output_data[outrow];
    inptr0 = input_data[inrow];
    inptr1 = input_data[inrow + 1];
    bias = 1;                   /* bias = 1,2,1,2,... for successive samples */
    for (outcol = 0; outcol < output_cols; outcol++) {
      *outptr++ =
        (JSAMPLE)((inptr0[0] + inptr0[1] + inptr1[0] + inptr1[1] + bias) >> 2);
      bias ^= 3;                /* 1=>2, 2=>1 */
      inptr0 += 2;  inptr1 += 2;
    }
    inrow += 2;
  }
}